

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

uint32_t __thiscall choc::value::ValueView::size(ValueView *this)

{
  uint32_t uVar1;
  ValueView *this_local;
  
  uVar1 = Type::getNumElements(&this->type);
  return uVar1;
}

Assistant:

inline uint32_t ValueView::size() const             { return type.getNumElements(); }